

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void rw::buildPlanes(Camera *cam)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ulong uVar13;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  float32 fVar26;
  Matrix *pMVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  V3d VVar32;
  V3d local_50;
  V3d local_40;
  V3d local_30;
  
  uVar1 = cam->frustumCorners[1].x;
  uVar14 = cam->frustumCorners[1].y;
  uVar2 = cam->frustumCorners[5].x;
  uVar15 = cam->frustumCorners[5].y;
  local_30.x = (float)uVar1 - (float)uVar2;
  local_30.y = (float)uVar14 - (float)uVar15;
  local_30.z = (float32)((float)cam->frustumCorners[1].z - (float)cam->frustumCorners[5].z);
  uVar3 = cam->frustumCorners[3].x;
  uVar16 = cam->frustumCorners[3].y;
  uVar4 = cam->frustumCorners[7].x;
  uVar17 = cam->frustumCorners[7].y;
  local_40.x = (float)uVar3 - (float)uVar4;
  local_40.y = (float)uVar16 - (float)uVar17;
  local_40.z = (float32)((float)cam->frustumCorners[3].z - (float)cam->frustumCorners[7].z);
  pMVar27 = Frame::getLTM((Frame *)(cam->object).object.parent);
  cam->frustumPlanes[0].plane.normal.z = (pMVar27->at).z;
  fVar26 = (pMVar27->at).y;
  cam->frustumPlanes[0].plane.normal.x = (pMVar27->at).x;
  cam->frustumPlanes[0].plane.normal.y = fVar26;
  fVar31 = (float)cam->frustumPlanes[0].plane.normal.z;
  fVar28 = -fVar31;
  cam->frustumPlanes[0].closestZ = fVar28 <= fVar31;
  uVar13._0_4_ = cam->frustumPlanes[0].plane.normal.x;
  uVar13._4_4_ = cam->frustumPlanes[0].plane.normal.y;
  cam->frustumPlanes[0].plane.distance =
       (float32)((float)cam->frustumCorners[4].z * fVar31 +
                (float)cam->frustumCorners[4].x * (float)(undefined4)uVar13 +
                (float)cam->frustumCorners[4].y * (float)uVar13._4_4_);
  cam->frustumPlanes[0].closestX = 0.0 <= (float)(undefined4)uVar13;
  cam->frustumPlanes[0].closestY = 0.0 <= (float)uVar13._4_4_;
  cam->frustumPlanes[1].plane.normal.x = (float32)(int)(uVar13 ^ 0x8000000080000000);
  cam->frustumPlanes[1].plane.normal.y = (float32)(int)((uVar13 ^ 0x8000000080000000) >> 0x20);
  cam->frustumPlanes[1].plane.normal.z = (float32)fVar28;
  cam->frustumPlanes[1].plane.distance =
       (float32)((-(float)(undefined4)uVar13 * (float)cam->frustumCorners[0].x +
                 -(float)uVar13._4_4_ * (float)cam->frustumCorners[0].y) -
                (float)cam->frustumCorners[0].z * fVar31);
  cam->frustumPlanes[1].closestX = (float)(undefined4)uVar13 <= 0.0;
  cam->frustumPlanes[1].closestY = (float)uVar13._4_4_ <= 0.0;
  cam->frustumPlanes[1].closestZ = fVar31 <= fVar28;
  uVar5 = cam->frustumCorners[5].x;
  uVar18 = cam->frustumCorners[5].y;
  uVar6 = cam->frustumCorners[6].x;
  uVar19 = cam->frustumCorners[6].y;
  local_50.z = (float32)((float)cam->frustumCorners[6].z - (float)cam->frustumCorners[5].z);
  local_50.x = (float)uVar6 - (float)uVar5;
  local_50.y = (float)uVar19 - (float)uVar18;
  VVar32 = cross(&local_30,&local_50);
  fVar29 = (float)VVar32.z;
  fVar31 = (float)VVar32.x;
  fVar28 = (float)VVar32.y;
  fVar30 = 1.0 / SQRT(fVar29 * fVar29 + fVar31 * fVar31 + fVar28 * fVar28);
  fVar29 = fVar29 * fVar30;
  fVar31 = fVar30 * fVar31;
  fVar30 = fVar30 * fVar28;
  cam->frustumPlanes[2].plane.normal.x = (float32)fVar31;
  cam->frustumPlanes[2].plane.normal.y = (float32)fVar30;
  cam->frustumPlanes[2].plane.normal.z = (float32)fVar29;
  cam->frustumPlanes[2].plane.distance =
       (float32)((float)cam->frustumCorners[1].z * fVar29 +
                (float)cam->frustumCorners[1].x * fVar31 + (float)cam->frustumCorners[1].y * fVar30)
  ;
  cam->frustumPlanes[2].closestX = 0.0 <= fVar31;
  cam->frustumPlanes[2].closestY = 0.0 <= fVar30;
  cam->frustumPlanes[2].closestZ = 0.0 <= fVar29;
  uVar7 = cam->frustumCorners[4].x;
  uVar20 = cam->frustumCorners[4].y;
  uVar8 = cam->frustumCorners[5].x;
  uVar21 = cam->frustumCorners[5].y;
  local_50.x = (float)uVar7 - (float)uVar8;
  local_50.y = (float)uVar20 - (float)uVar21;
  local_50.z = (float32)((float)cam->frustumCorners[4].z - (float)cam->frustumCorners[5].z);
  VVar32 = cross(&local_50,&local_30);
  fVar29 = (float)VVar32.z;
  fVar31 = (float)VVar32.x;
  fVar28 = (float)VVar32.y;
  fVar30 = 1.0 / SQRT(fVar29 * fVar29 + fVar31 * fVar31 + fVar28 * fVar28);
  fVar29 = fVar29 * fVar30;
  fVar31 = fVar30 * fVar31;
  fVar30 = fVar30 * fVar28;
  cam->frustumPlanes[3].plane.normal.x = (float32)fVar31;
  cam->frustumPlanes[3].plane.normal.y = (float32)fVar30;
  cam->frustumPlanes[3].plane.normal.z = (float32)fVar29;
  cam->frustumPlanes[3].plane.distance =
       (float32)((float)cam->frustumCorners[1].z * fVar29 +
                (float)cam->frustumCorners[1].x * fVar31 + (float)cam->frustumCorners[1].y * fVar30)
  ;
  cam->frustumPlanes[3].closestX = 0.0 <= fVar31;
  cam->frustumPlanes[3].closestY = 0.0 <= fVar30;
  cam->frustumPlanes[3].closestZ = 0.0 <= fVar29;
  uVar9 = cam->frustumCorners[4].x;
  uVar22 = cam->frustumCorners[4].y;
  uVar10 = cam->frustumCorners[7].x;
  uVar23 = cam->frustumCorners[7].y;
  local_50.x = (float)uVar9 - (float)uVar10;
  local_50.y = (float)uVar22 - (float)uVar23;
  local_50.z = (float32)((float)cam->frustumCorners[4].z - (float)cam->frustumCorners[7].z);
  VVar32 = cross(&local_40,&local_50);
  fVar29 = (float)VVar32.z;
  fVar31 = (float)VVar32.x;
  fVar28 = (float)VVar32.y;
  fVar30 = 1.0 / SQRT(fVar29 * fVar29 + fVar31 * fVar31 + fVar28 * fVar28);
  fVar29 = fVar29 * fVar30;
  fVar31 = fVar30 * fVar31;
  fVar30 = fVar30 * fVar28;
  cam->frustumPlanes[4].plane.normal.x = (float32)fVar31;
  cam->frustumPlanes[4].plane.normal.y = (float32)fVar30;
  cam->frustumPlanes[4].plane.normal.z = (float32)fVar29;
  cam->frustumPlanes[4].plane.distance =
       (float32)((float)cam->frustumCorners[3].z * fVar29 +
                (float)cam->frustumCorners[3].x * fVar31 + (float)cam->frustumCorners[3].y * fVar30)
  ;
  cam->frustumPlanes[4].closestX = 0.0 <= fVar31;
  cam->frustumPlanes[4].closestY = 0.0 <= fVar30;
  cam->frustumPlanes[4].closestZ = 0.0 <= fVar29;
  uVar11 = cam->frustumCorners[6].x;
  uVar24 = cam->frustumCorners[6].y;
  uVar12 = cam->frustumCorners[7].x;
  uVar25 = cam->frustumCorners[7].y;
  local_50.x = (float)uVar11 - (float)uVar12;
  local_50.y = (float)uVar24 - (float)uVar25;
  local_50.z = (float32)((float)cam->frustumCorners[6].z - (float)cam->frustumCorners[7].z);
  VVar32 = cross(&local_50,&local_40);
  fVar29 = (float)VVar32.z;
  fVar31 = (float)VVar32.x;
  fVar28 = (float)VVar32.y;
  fVar30 = 1.0 / SQRT(fVar29 * fVar29 + fVar31 * fVar31 + fVar28 * fVar28);
  fVar29 = fVar29 * fVar30;
  fVar31 = fVar30 * fVar31;
  fVar30 = fVar30 * fVar28;
  cam->frustumPlanes[5].plane.normal.x = (float32)fVar31;
  cam->frustumPlanes[5].plane.normal.y = (float32)fVar30;
  cam->frustumPlanes[5].plane.normal.z = (float32)fVar29;
  cam->frustumPlanes[5].plane.distance =
       (float32)((float)cam->frustumCorners[3].z * fVar29 +
                (float)cam->frustumCorners[3].x * fVar31 + (float)cam->frustumCorners[3].y * fVar30)
  ;
  cam->frustumPlanes[5].closestX = 0.0 <= fVar31;
  cam->frustumPlanes[5].closestY = 0.0 <= fVar30;
  cam->frustumPlanes[5].closestZ = 0.0 <= fVar29;
  return;
}

Assistant:

static void
buildPlanes(Camera *cam)
{
	V3d *c = cam->frustumCorners;
	FrustumPlane *p = cam->frustumPlanes;
	V3d v51 = sub(c[1], c[5]);
	V3d v73 = sub(c[3], c[7]);

	/* Far plane */
	p[0].plane.normal = cam->getFrame()->getLTM()->at;
	p[0].plane.distance = dot(p[0].plane.normal, c[4]);
	p[0].closestX = p[0].plane.normal.x < 0.0f ? 0 : 1;
	p[0].closestY = p[0].plane.normal.y < 0.0f ? 0 : 1;
	p[0].closestZ = p[0].plane.normal.z < 0.0f ? 0 : 1;

	/* Near plane */
	p[1].plane.normal = neg(p[0].plane.normal);
	p[1].plane.distance = dot(p[1].plane.normal, c[0]);
	p[1].closestX = p[1].plane.normal.x < 0.0f ? 0 : 1;
	p[1].closestY = p[1].plane.normal.y < 0.0f ? 0 : 1;
	p[1].closestZ = p[1].plane.normal.z < 0.0f ? 0 : 1;

	/* Right plane */
	p[2].plane.normal = normalize(cross(v51,
	                                    sub(c[6], c[5])));
	p[2].plane.distance = dot(p[2].plane.normal, c[1]);
	p[2].closestX = p[2].plane.normal.x < 0.0f ? 0 : 1;
	p[2].closestY = p[2].plane.normal.y < 0.0f ? 0 : 1;
	p[2].closestZ = p[2].plane.normal.z < 0.0f ? 0 : 1;

	/* Top plane */
	p[3].plane.normal = normalize(cross(sub(c[4], c[5]),
	                                    v51));
	p[3].plane.distance = dot(p[3].plane.normal, c[1]);
	p[3].closestX = p[3].plane.normal.x < 0.0f ? 0 : 1;
	p[3].closestY = p[3].plane.normal.y < 0.0f ? 0 : 1;
	p[3].closestZ = p[3].plane.normal.z < 0.0f ? 0 : 1;

	/* Left plane */
	p[4].plane.normal = normalize(cross(v73,
	                                    sub(c[4], c[7])));
	p[4].plane.distance = dot(p[4].plane.normal, c[3]);
	p[4].closestX = p[4].plane.normal.x < 0.0f ? 0 : 1;
	p[4].closestY = p[4].plane.normal.y < 0.0f ? 0 : 1;
	p[4].closestZ = p[4].plane.normal.z < 0.0f ? 0 : 1;

	/* Bottom plane */
	p[5].plane.normal = normalize(cross(sub(c[6], c[7]),
	                                    v73));
	p[5].plane.distance = dot(p[5].plane.normal, c[3]);
	p[5].closestX = p[5].plane.normal.x < 0.0f ? 0 : 1;
	p[5].closestY = p[5].plane.normal.y < 0.0f ? 0 : 1;
	p[5].closestZ = p[5].plane.normal.z < 0.0f ? 0 : 1;
}